

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O1

string_view __thiscall chain::str::trim_right_view(str *this,string_view data)

{
  str *psVar1;
  str *psVar2;
  int iVar3;
  str *psVar4;
  str *psVar5;
  string_view sVar6;
  
  if (this != (str *)0x0) {
    psVar1 = this + -1;
    psVar5 = (str *)0xffffffffffffffff;
    if ((long)psVar1 < -1) {
      psVar5 = psVar1;
    }
    do {
      psVar4 = psVar1;
      psVar2 = psVar5;
      if ((long)psVar4 < 0) break;
      iVar3 = isspace((uint)(byte)((char *)data._M_len)[(long)psVar4]);
      psVar1 = psVar4 + -1;
      psVar2 = psVar4;
    } while (iVar3 != 0);
    if (psVar2 + 1 <= this) {
      this = psVar2 + 1;
    }
  }
  sVar6._M_str = (char *)data._M_len;
  sVar6._M_len = (size_t)this;
  return sVar6;
}

Assistant:

auto trim_right_view(std::string_view data) -> std::string_view
{
    if (!data.empty())
    {
        int64_t index = static_cast<int64_t>(data.length() - 1);
        while (index >= 0)
        {
            if (!std::isspace(static_cast<unsigned char>(data[static_cast<std::size_t>(index)])))
            {
                break;
            }
            else
            {
                --index;
            }
        }

        data = data.substr(0, static_cast<std::size_t>(index + 1));
    }

    return data;
}